

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
AddProperty<Js::PropertyRecord_const*>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *this,
          DynamicObject *instance,PropertyRecord *propertyKey,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  BOOL BVar4;
  int iVar5;
  PropertyId propertyId_00;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar6;
  SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *this_00;
  DynamicType *pDVar7;
  SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *this_01;
  undefined4 *puVar8;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar9;
  RecyclerWeakReference<Js::DynamicObject> *pRVar10;
  DynamicObject *pDVar11;
  SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_02;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar12;
  PropertyRecord **ppPVar13;
  bool local_8b;
  bool local_8a;
  bool local_89;
  PropertyRecord *pPStack_78;
  PropertyId propertyId;
  PropertyRecord *deletedPropertyKey;
  unsigned_short index;
  bool markAsFixed;
  BigSimpleDictionaryTypeHandler *pBStack_68;
  bool markAsInitialized;
  BigSimpleDictionaryTypeHandler *newTypeHandler;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *typeHandler;
  bool throwIfNotExtensible;
  bool isForce;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  ScriptContext *scriptContext;
  PropertyValueInfo *info_local;
  Var pvStack_30;
  PropertyAttributes attributes_local;
  Var value_local;
  PropertyRecord *propertyKey_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_local;
  
  scriptContext = (ScriptContext *)info;
  info_local._7_1_ = attributes;
  pvStack_30 = value;
  value_local = propertyKey;
  propertyKey_local = (PropertyRecord *)instance;
  instance_local = (DynamicObject *)this;
  descriptor = (SimpleDictionaryPropertyDescriptor<unsigned_short> *)
               RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  bVar2 = TMapKey_IsJavascriptString<Js::PropertyRecord_const*>();
  if ((!bVar2) ||
     (bVar2 = TMapKey_IsSymbol((PropertyRecord *)value_local,(ScriptContext *)descriptor), !bVar2))
  {
    pBVar6 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
             ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
                           *)(this + 0x18));
    bVar2 = JsUtil::
            BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
            ::TryGetReference<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                        *)pBVar6,(PropertyRecord **)&value_local,
                       (SimpleDictionaryPropertyDescriptor<unsigned_short> **)
                       &stack0xffffffffffffffb0);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xa6e,"(!propertyMap->TryGetReference(propertyKey, &descriptor))"
                                  ,"!propertyMap->TryGetReference(propertyKey, &descriptor)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  bVar2 = TPropertyKey_IsNumeric<Js::PropertyRecord_const*>((PropertyRecord *)value_local);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xa70,"(!TPropertyKey_IsNumeric(propertyKey))",
                                "!TPropertyKey_IsNumeric(propertyKey)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if ((((((DAT_01eca29c & 1) != 0) &&
        (bVar2 = TMapKey_IsJavascriptString<Js::PropertyRecord_const*>(), !bVar2)) &&
       (((byte)this[0x28] >> 1 & 1) == 0)) &&
      ((((byte)this[0x28] >> 2 & 1) == 0 &&
       (bVar2 = TPropertyKey_IsInternalPropertyId((PropertyRecord *)value_local), !bVar2)))) &&
     (bVar2 = TMapKey_IsSymbol((PropertyRecord *)value_local,(ScriptContext *)descriptor), !bVar2))
  {
    this_00 = (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *)
              ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,true>
                        (this,(DynamicObject *)propertyKey_local);
    BVar4 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
            AddProperty<Js::PropertyRecord_const*>
                      (this_00,(DynamicObject *)propertyKey_local,(PropertyRecord *)value_local,
                       pvStack_30,info_local._7_1_,(PropertyValueInfo *)scriptContext,flags,
                       possibleSideEffects);
    return BVar4;
  }
  typeHandler._7_1_ = (flags & PropertyOperation_Force) != PropertyOperation_None;
  if (!(bool)typeHandler._7_1_) {
    typeHandler._6_1_ =
         (flags & (PropertyOperation_ThrowIfNotExtensible|PropertyOperation_StrictMode)) !=
         PropertyOperation_None;
    bVar2 = DynamicTypeHandler::VerifyIsExtensible
                      ((DynamicTypeHandler *)this,(ScriptContext *)descriptor,
                       (bool)typeHandler._6_1_);
    if (!bVar2) {
      return 0;
    }
  }
  newTypeHandler = (BigSimpleDictionaryTypeHandler *)this;
  bVar2 = DynamicTypeHandler::GetIsLocked((DynamicTypeHandler *)this);
  if (bVar2) {
    newTypeHandler =
         (BigSimpleDictionaryTypeHandler *)
         SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
         ConvertToNonSharedSimpleDictionaryType
                   ((SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                     *)this,(DynamicObject *)propertyKey_local);
  }
  else {
    pDVar7 = DynamicObject::GetDynamicType((DynamicObject *)propertyKey_local);
    bVar2 = DynamicType::GetIsLocked(pDVar7);
    if (bVar2) {
      bVar2 = DynamicTypeHandler::GetIsShared((DynamicTypeHandler *)this);
      if (bVar2) {
LAB_0146ef9d:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xa93,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      else {
        pDVar7 = DynamicObject::GetDynamicType((DynamicObject *)propertyKey_local);
        bVar2 = DynamicType::GetIsShared(pDVar7);
        if (bVar2) goto LAB_0146ef9d;
      }
      DynamicObject::ChangeType((DynamicObject *)propertyKey_local);
    }
  }
  bVar2 = TMapKey_IsJavascriptString<Js::PropertyRecord_const*>();
  if ((bVar2) &&
     ((bVar2 = TPropertyKey_IsInternalPropertyId((PropertyRecord *)value_local), bVar2 ||
      (bVar2 = TMapKey_IsSymbol((PropertyRecord *)value_local,(ScriptContext *)descriptor), bVar2)))
     ) {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,TypeHandlerTransitionPhase);
    if (bVar2) {
      Output::Print(
                   L"Transitioning from string keyed to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"
                   );
      Output::Flush();
    }
    this_01 = (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *)
              ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::PropertyRecord_const*,true>
                        (this,(DynamicObject *)propertyKey_local);
    BVar4 = AddProperty<Js::PropertyRecord_const*>
                      (this_01,(DynamicObject *)propertyKey_local,(PropertyRecord *)value_local,
                       pvStack_30,info_local._7_1_,(PropertyValueInfo *)scriptContext,flags,
                       possibleSideEffects);
    return BVar4;
  }
  iVar5 = DynamicTypeHandler::GetSlotCapacity((DynamicTypeHandler *)this);
  if (iVar5 <= (int)(uint)*(ushort *)(this + 0x2a)) {
    iVar5 = DynamicTypeHandler::GetSlotCapacity((DynamicTypeHandler *)this);
    if (0xfffd < iVar5) {
      pBStack_68 = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                   ::ConvertToBigSimpleDictionaryTypeHandler
                             ((SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                               *)this,(DynamicObject *)propertyKey_local);
      BVar4 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
              AddProperty<Js::PropertyRecord_const*>
                        ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)
                         pBStack_68,(DynamicObject *)propertyKey_local,(PropertyRecord *)value_local
                         ,pvStack_30,info_local._7_1_,(PropertyValueInfo *)scriptContext,flags,
                         possibleSideEffects);
      return BVar4;
    }
    SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
    EnsureSlotCapacity((SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                        *)newTypeHandler,(DynamicObject *)propertyKey_local);
  }
  if (((flags & PropertyOperation_SpecialValue) == PropertyOperation_None) &&
     (pvStack_30 == (Var)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xaaf,
                                "((flags & PropertyOperation_SpecialValue) != 0 || value != nullptr)"
                                ,"(flags & PropertyOperation_SpecialValue) != 0 || value != nullptr"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  bVar2 = DynamicTypeHandler::GetIsShared(&newTypeHandler->super_DynamicTypeHandler);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xab0,"(!typeHandler->GetIsShared())","!typeHandler->GetIsShared()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  ppRVar9 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                      ((WriteBarrierPtr *)&newTypeHandler->singletonInstance);
  if (*ppRVar9 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    pRVar10 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::operator->
                        (&newTypeHandler->singletonInstance);
    pDVar11 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(pRVar10);
    if (pDVar11 != (DynamicObject *)propertyKey_local) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xab1,
                                  "(typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance)"
                                  ,
                                  "typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  deletedPropertyKey._7_1_ = (flags & PropertyOperation_PreInit) == PropertyOperation_None;
  local_89 = false;
  if ((bool)deletedPropertyKey._7_1_) {
    bVar2 = TPropertyKey_IsInternalPropertyId((PropertyRecord *)value_local);
    local_89 = false;
    if ((!bVar2) &&
       (local_89 = false,
       (flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
       PropertyOperation_None)) {
      ppRVar9 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                          ((WriteBarrierPtr *)&newTypeHandler->singletonInstance);
      local_89 = false;
      if (*ppRVar9 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
        pRVar10 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::
                  operator->(&newTypeHandler->singletonInstance);
        pDVar11 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(pRVar10);
        local_89 = false;
        if (pDVar11 == (DynamicObject *)propertyKey_local) {
          bVar2 = VarIs<Js::JavascriptFunction>(pvStack_30);
          if (bVar2) {
            local_8a = DynamicTypeHandler::ShouldFixMethodProperties();
          }
          else {
            bVar2 = DynamicTypeHandler::ShouldFixDataProperties();
            local_8b = false;
            if (bVar2) {
              local_8b = DynamicTypeHandler::CheckHeuristicsForFixedDataProps
                                   ((DynamicObject *)propertyKey_local,(PropertyRecord *)value_local
                                    ,pvStack_30);
            }
            local_8a = local_8b;
          }
          local_89 = local_8a;
        }
      }
    }
  }
  deletedPropertyKey._6_1_ = local_89;
  if (((byte)newTypeHandler->field_0x28 >> 1 & 1) != 0) {
    this_02 = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
              AsUnordered((SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                           *)newTypeHandler);
    bVar2 = SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true>::
            TryReuseDeletedPropertyIndex
                      (this_02,(DynamicObject *)propertyKey_local,
                       (unsigned_short *)((long)&deletedPropertyKey + 4));
    if (bVar2) {
      pBVar6 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
               ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
                             *)&newTypeHandler->propertyMap);
      pSVar12 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                ::GetValueAt(pBVar6,(uint)deletedPropertyKey._4_2_);
      if (pSVar12->propertyIndex != deletedPropertyKey._4_2_) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xac0,
                                    "(typeHandler->propertyMap->GetValueAt(index).propertyIndex == index)"
                                    ,
                                    "typeHandler->propertyMap->GetValueAt(index).propertyIndex == index"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pBVar6 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
               ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
                             *)&newTypeHandler->propertyMap);
      ppPVar13 = JsUtil::
                 BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt(pBVar6,(uint)deletedPropertyKey._4_2_);
      pPStack_78 = *ppPVar13;
      pBVar6 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
               ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
                             *)&newTypeHandler->propertyMap);
      JsUtil::
      BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
      ::Remove(pBVar6,&stack0xffffffffffffff88);
      Add<Js::PropertyRecord_const*>
                ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *)
                 newTypeHandler,deletedPropertyKey._4_2_,(PropertyRecord *)value_local,
                 info_local._7_1_,(bool)(deletedPropertyKey._7_1_ & 1),
                 (bool)(deletedPropertyKey._6_1_ & 1),false,(ScriptContext *)descriptor);
      goto LAB_0146f563;
    }
  }
  deletedPropertyKey._4_2_ = *(unsigned_short *)(this + 0x2a);
  Add<Js::PropertyRecord_const*>
            ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *)
             newTypeHandler,(PropertyRecord *)value_local,info_local._7_1_,
             (bool)(deletedPropertyKey._7_1_ & 1),(bool)(deletedPropertyKey._6_1_ & 1),false,
             (ScriptContext *)descriptor);
LAB_0146f563:
  if ((info_local._7_1_ & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties((DynamicObject *)propertyKey_local,false);
  }
  DynamicTypeHandler::SetSlotUnchecked
            ((DynamicObject *)propertyKey_local,(uint)deletedPropertyKey._4_2_,pvStack_30);
  if (((deletedPropertyKey._7_1_ & 1) == 0) || ((deletedPropertyKey._6_1_ & 1) != 0)) {
    PropertyValueInfo::SetNoCache
              ((PropertyValueInfo *)scriptContext,(RecyclableObject *)propertyKey_local);
  }
  else {
    SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
    SetPropertyValueInfoNonFixed
              ((SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *)
               this,(PropertyValueInfo *)scriptContext,(RecyclableObject *)propertyKey_local,
               deletedPropertyKey._4_2_,info_local._7_1_,InlineCacheNoFlags);
  }
  propertyId_00 =
       TPropertyKey_GetOptionalPropertyId<Js::PropertyRecord_const*>
                 ((ScriptContext *)descriptor,(PropertyRecord *)value_local);
  if (propertyId_00 != -1) {
    bVar3 = DynamicTypeHandler::GetFlags(&newTypeHandler->super_DynamicTypeHandler);
    if (((bVar3 & 0x20) != 0) ||
       ((BVar4 = IsInternalPropertyId(propertyId_00), BVar4 == 0 &&
        (BVar4 = Js::JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty
                           ((RecyclableObject *)propertyKey_local,propertyId_00), BVar4 != 0)))) {
      ScriptContext::InvalidateProtoCaches((ScriptContext *)descriptor,propertyId_00);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,(DynamicObject *)propertyKey_local,propertyId_00,
               pvStack_30,possibleSideEffects);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::AddProperty(DynamicObject* instance, TPropertyKey propertyKey, Var value, PropertyAttributes attributes,
        PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
#if DBG
        // Only Assert that the propertyMap doesn't contain propertyKey if TMapKey is string and propertyKey is not a symbol.
        if (!TMapKey_IsJavascriptString<TMapKey>() || !TMapKey_IsSymbol(propertyKey, scriptContext))
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            Assert(!propertyMap->TryGetReference(propertyKey, &descriptor));
        }
        Assert(!TPropertyKey_IsNumeric(propertyKey));
#endif

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
            !TMapKey_IsJavascriptString<TMapKey>() &&
            !isUnordered && !hasNamelessPropertyId &&
            !TPropertyKey_IsInternalPropertyId(propertyKey) &&
            !TMapKey_IsSymbol(propertyKey, scriptContext))
        {
            return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                ->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
        }
#endif

        if (IsNotExtensibleSupported)
        {
            bool isForce = (flags & PropertyOperation_Force) != 0;
            if (!isForce)
            {
                bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;
                if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                {
                    return FALSE;
                }
            }
        }

        SimpleDictionaryTypeHandlerBase * typeHandler = this;
        if (GetIsLocked())
        {
            typeHandler = ConvertToNonSharedSimpleDictionaryType(instance);
        }
        else if(instance->GetDynamicType()->GetIsLocked())
        {
            Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

            // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
            instance->ChangeType();
        }

        if (TMapKey_IsJavascriptString<TMapKey>() &&
            (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext)))
        {
            PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning from string keyed to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
            // String keyed type handler cannot store InternalPropertyRecords since they have no string representation
            return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, const PropertyRecord*, IsNotExtensibleSupported>(instance)
                ->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
        }

        // CONSIDER: Do this after TryReuseDeletedPropertyIndex. If we can reuse slots, no need to grow right now.
        if (this->GetSlotCapacity() <= nextPropertyIndex)
        {
            if (this->GetSlotCapacity() >= MaxPropertyIndexSize)
            {
                BigSimpleDictionaryTypeHandler* newTypeHandler = ConvertToBigSimpleDictionaryTypeHandler(instance);

                return newTypeHandler->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
            }

            typeHandler->EnsureSlotCapacity(instance);
        }

        Assert((flags & PropertyOperation_SpecialValue) != 0 || value != nullptr);
        Assert(!typeHandler->GetIsShared());
        Assert(typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance);
#if ENABLE_FIXED_FIELDS
        bool markAsInitialized = ((flags & PropertyOperation_PreInit) == 0);
        bool markAsFixed = markAsInitialized && !TPropertyKey_IsInternalPropertyId(propertyKey) && (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0 &&
            typeHandler->singletonInstance != nullptr && typeHandler->singletonInstance->Get() == instance
            && (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyKey, value)));
#else
        bool markAsInitialized = true;
        bool markAsFixed = false;
#endif
        TPropertyIndex index;
        if (typeHandler->isUnordered &&
            typeHandler->AsUnordered()->TryReuseDeletedPropertyIndex(instance, &index))
        {
            // We are reusing a deleted property index for the new property ID. Update the property map.
            Assert(typeHandler->propertyMap->GetValueAt(index).propertyIndex == index);
            TMapKey deletedPropertyKey = typeHandler->propertyMap->GetKeyAt(index);
            typeHandler->propertyMap->Remove(deletedPropertyKey);
            typeHandler->Add(index, propertyKey, attributes, markAsInitialized, markAsFixed, false, scriptContext);
        }
        else
        {
            index = nextPropertyIndex;
            typeHandler->Add(propertyKey, attributes, markAsInitialized, markAsFixed, false, scriptContext);
        }

        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }

        SetSlotUnchecked(instance, index, value);

        // It's ok to populate inline cache here even if this handler isn't shared yet, because we don't have property add
        // inline cache flavor for SimpleDictionaryTypeHandlers.  This ensures that a) no new instance reaches this handler
        // without us knowing, and b) the inline cache doesn't inadvertently become polymorphic.
        if (markAsInitialized && !markAsFixed)
        {
            SetPropertyValueInfoNonFixed(info, instance, index, attributes);
        }
        else
        {
            PropertyValueInfo::SetNoCache(info, instance);
        }

        PropertyId propertyId = TPropertyKey_GetOptionalPropertyId(scriptContext, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            if ((typeHandler->GetFlags() & IsPrototypeFlag)
                || (!IsInternalPropertyId(propertyId)
                && JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty(instance, propertyId)))
            {
                // We don't evolve dictionary types when adding a field, so we need to invalidate prototype caches.
                // We only have to do this though if the current type is used as a prototype, or the current property
                // is found on the prototype chain.
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
        }
        return true;
    }